

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.c
# Opt level: O0

_Bool player_stat_inc(player *p,wchar_t stat)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t local_24;
  wchar_t gain;
  wchar_t v;
  wchar_t stat_local;
  player *p_local;
  
  iVar1 = (int)p->stat_cur[stat];
  if (iVar1 < 0x76) {
    if (iVar1 < 0x12) {
      p->stat_cur[stat] = p->stat_cur[stat] + 1;
    }
    else if (iVar1 < 0x6c) {
      local_24 = ((0x76 - iVar1) / 2 + 3) / 2;
      if ((int)local_24 < 1) {
        local_24 = 1;
      }
      uVar2 = Rand_div(local_24);
      p->stat_cur[stat] = p->stat_cur[stat] + (short)uVar2 + 1 + (short)((int)local_24 / 2);
      if (0x75 < p->stat_cur[stat]) {
        p->stat_cur[stat] = 0x75;
      }
    }
    else {
      p->stat_cur[stat] = 0x76;
    }
    if (p->stat_max[stat] < p->stat_cur[stat]) {
      p->stat_max[stat] = p->stat_cur[stat];
    }
    p->upkeep->update = p->upkeep->update | 1;
    p_local._7_1_ = true;
  }
  else {
    p_local._7_1_ = false;
  }
  return p_local._7_1_;
}

Assistant:

bool player_stat_inc(struct player *p, int stat)
{
	int v = p->stat_cur[stat];

	if (v >= 18 + 100)
		return false;
	if (v < 18) {
		p->stat_cur[stat]++;
	} else if (v < 18 + 90) {
		int gain = (((18 + 100) - v) / 2 + 3) / 2;
		if (gain < 1)
			gain = 1;
		p->stat_cur[stat] += randint1(gain) + gain / 2;
		if (p->stat_cur[stat] > 18 + 99)
			p->stat_cur[stat] = 18 + 99;
	} else {
		p->stat_cur[stat] = 18 + 100;
	}

	if (p->stat_cur[stat] > p->stat_max[stat])
		p->stat_max[stat] = p->stat_cur[stat];
	
	p->upkeep->update |= PU_BONUS;
	return true;
}